

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O3

char * getVarName(char *suffixFormula,int startLoc,int *endLocation)

{
  long lVar1;
  char *__dest;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = (long)startLoc;
  uVar2 = (ulong)(byte)suffixFormula[lVar5];
  if ((uVar2 < 0x3b) && ((0x400000100000601U >> (uVar2 & 0x3f) & 1) != 0)) {
    __dest = (char *)0x0;
  }
  else {
    uVar4 = 0;
    while ((0x3a < (byte)uVar2 || ((0x400000100000601U >> (uVar2 & 0x3f) & 1) == 0))) {
      lVar1 = uVar4 + lVar5 + 1;
      uVar4 = uVar4 + 1;
      uVar2 = (ulong)(byte)suffixFormula[lVar1];
    }
    iVar3 = (int)uVar4;
    *endLocation = startLoc + iVar3;
    __dest = (char *)malloc((long)(iVar3 + 1));
    if (iVar3 < 1) {
      uVar4 = 0;
    }
    else {
      memcpy(__dest,suffixFormula + lVar5,uVar4);
      uVar4 = uVar4 & 0xffffffff;
    }
    __dest[uVar4] = '\0';
  }
  return __dest;
}

Assistant:

char *getVarName( char *suffixFormula, int startLoc, int *endLocation )
{
	int i = startLoc, length;
	char *name;

	if( isNotVarNameSymbol( suffixFormula[startLoc] ) )
		return NULL;

	while( !isNotVarNameSymbol( suffixFormula[i] ) )
		i++;
	*endLocation = i;
	length = i - startLoc;
	name = (char *)malloc( sizeof(char) * (length + 1));
	for( i=0; i<length; i++ )
		name[i] = suffixFormula[i+startLoc];
	name[i] = '\0';

	return name;
}